

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_dse_ustore(jit_State *J)

{
  jit_State *pjVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  AliasRet AVar6;
  TRef TVar7;
  long in_RDI;
  IRIns *obar;
  IRRef1 *bp;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef1 *refp;
  IRIns *xr;
  IRRef val;
  IRRef xref;
  undefined2 *local_60;
  ushort *local_58;
  jit_State *in_stack_ffffffffffffffb0;
  uint local_3c;
  uint16_t *local_38;
  
  uVar5 = (uint)*(ushort *)(in_RDI + 0xa0);
  sVar2 = *(short *)(in_RDI + 0xa2);
  lVar4 = *(long *)(in_RDI + 0x10);
  local_38 = (uint16_t *)(in_RDI + 0x216);
  uVar3 = *local_38;
  while (local_3c = (uint)uVar3, uVar5 < local_3c) {
    pjVar1 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)local_3c * 8);
    AVar6 = aa_uref((IRIns *)(lVar4 + (ulong)uVar5 * 8),
                    (IRIns *)(*(long *)(in_RDI + 0x10) +
                             (ulong)(ushort)(pjVar1->cur).nextgc.gcptr32 * 8));
    if (AVar6 != ALIAS_NO) {
      if (AVar6 == ALIAS_MAY) {
        if (*(short *)((long)&(pjVar1->cur).nextgc.gcptr32 + 2) != sVar2) break;
      }
      else if (AVar6 == ALIAS_MUST) {
        if (*(short *)((long)&(pjVar1->cur).nextgc.gcptr32 + 2) == sVar2) {
          return 4;
        }
        if (*(ushort *)(in_RDI + 0x1a4) < local_3c) {
          in_stack_ffffffffffffffb0 =
               (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)(*(int *)(in_RDI + 8) - 1) * 8);
          goto LAB_0019a6c0;
        }
        break;
      }
    }
    local_38 = &(pjVar1->cur).nsnap;
    uVar3 = (pjVar1->cur).nsnap;
  }
LAB_0019a853:
  TVar7 = lj_ir_emit(in_stack_ffffffffffffffb0);
  return TVar7;
LAB_0019a6c0:
  if (in_stack_ffffffffffffffb0 <= pjVar1) goto LAB_0019a6f6;
  if (((in_stack_ffffffffffffffb0->cur).marked & 0x80) != 0) goto LAB_0019a853;
  in_stack_ffffffffffffffb0 = (jit_State *)&in_stack_ffffffffffffffb0[-1].prev_line;
  goto LAB_0019a6c0;
LAB_0019a6f6:
  *local_38 = (pjVar1->cur).nsnap;
  (pjVar1->cur).marked = '\0';
  (pjVar1->cur).gct = '\f';
  *(undefined2 *)((long)&(pjVar1->cur).nextgc.gcptr32 + 2) = 0;
  *(undefined2 *)&(pjVar1->cur).nextgc.gcptr32 = 0;
  (pjVar1->cur).nsnap = 0;
  if (((local_3c + 1 < *(uint *)(in_RDI + 8)) &&
      (*(char *)((long)&(pjVar1->cur).gclist.gcptr32 + 1) == 'W')) &&
     ((ushort)(pjVar1->cur).nins == uVar5)) {
    local_58 = (ushort *)(in_RDI + 0x230);
    local_60 = (undefined2 *)(*(long *)(in_RDI + 0x10) + (ulong)*local_58 * 8);
    while (local_3c + 1 < (uint)*local_58) {
      local_58 = local_60 + 3;
      local_60 = (undefined2 *)(*(long *)(in_RDI + 0x10) + (ulong)*local_58 * 8);
    }
    *local_58 = local_60[3];
    local_60[2] = 0xc00;
    local_60[1] = 0;
    *local_60 = 0;
    local_60[3] = 0;
  }
  goto LAB_0019a853;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ustore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[IR_USTORE];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads). */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	if (ref+1 < J->cur.nins &&
	    store[1].o == IR_OBAR && store[1].op1 == xref) {
	  IRRef1 *bp = &J->chain[IR_OBAR];
	  IRIns *obar;
	  for (obar = IR(*bp); *bp > ref+1; obar = IR(*bp))
	    bp = &obar->prev;
	  /* Remove OBAR, too. */
	  *bp = obar->prev;
	  lj_ir_nop(obar);
	}
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}